

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcBonesOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  uchar *puVar5;
  IntBone_MDL7 *pIVar6;
  pointer paVar7;
  undefined8 uVar8;
  aiAnimation *this_00;
  pointer paVar9;
  aiNodeAnim **ppaVar10;
  aiNodeAnim *paVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  aiAnimation **ppaVar14;
  uint qq_1;
  ulong uVar15;
  aiQuatKey *paVar16;
  uint uVar17;
  pointer paVar18;
  long lVar19;
  size_t qq;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  IntBone_MDL7 *intBone;
  undefined4 uVar23;
  undefined4 uVar24;
  uint local_464;
  undefined1 local_430 [1024];
  
  if (apcBonesOut == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcBonesOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x6c8,
                  "void Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(const MDL::IntBone_MDL7 **)"
                 );
  }
  puVar5 = this->mBuffer;
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  uVar21 = (ulong)*(uint *)(puVar5 + 8);
  for (uVar15 = 0; uVar15 < uVar21; uVar15 = uVar15 + 1) {
    pIVar6 = apcBonesOut[uVar15];
    paVar18 = (pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar9 = (pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (paVar18 != paVar9) {
      lVar19 = 0;
      for (uVar20 = 0; uVar20 < (ulong)(((long)paVar9 - (long)paVar18) / 0x18); uVar20 = uVar20 + 1)
      {
        dVar3 = *(double *)((long)&paVar18->mTime + lVar19);
        uVar23 = SUB84(dVar3,0);
        uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
        dVar4 = this_00->mDuration;
        if (dVar3 <= dVar4) {
          uVar23 = SUB84(dVar4,0);
          uVar24 = (undefined4)((ulong)dVar4 >> 0x20);
        }
        this_00->mDuration = (double)CONCAT44(uVar24,uVar23);
        paVar18 = (pIVar6->pkeyPositions).
                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar9 = (pIVar6->pkeyPositions).
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar19 = lVar19 + 0x18;
      }
      this_00->mNumChannels = this_00->mNumChannels + 1;
    }
  }
  if ((this_00->mDuration == 0.0) && (!NAN(this_00->mDuration))) {
    aiAnimation::~aiAnimation(this_00);
    operator_delete(this_00,0x448);
    return;
  }
  ppaVar10 = (aiNodeAnim **)operator_new__((ulong)this_00->mNumChannels << 3);
  this_00->mChannels = ppaVar10;
  local_464 = 0;
  for (uVar15 = 0; uVar15 < uVar21; uVar15 = uVar15 + 1) {
    pIVar6 = apcBonesOut[uVar15];
    if ((pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar11 = (aiNodeAnim *)operator_new(0x438);
      (paVar11->mNodeName).length = 0;
      (paVar11->mNodeName).data[0] = '\0';
      memset((paVar11->mNodeName).data + 1,0x1b,0x3ff);
      paVar11->mRotationKeys = (aiQuatKey *)0x0;
      paVar11->mNumScalingKeys = 0;
      *(undefined8 *)&paVar11->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar11->mPositionKeys + 4) = 0;
      paVar11->mScalingKeys = (aiVectorKey *)0x0;
      paVar11->mPreState = aiAnimBehaviour_DEFAULT;
      paVar11->mPostState = aiAnimBehaviour_DEFAULT;
      this_00->mChannels[local_464] = paVar11;
      uVar17 = (pIVar6->super_aiBone).mName.length;
      if (0x3fe < uVar17) {
        uVar17 = 0x3ff;
      }
      uVar21 = (ulong)uVar17;
      memcpy(local_430,(pIVar6->super_aiBone).mName.data,uVar21);
      local_430[uVar21] = 0;
      (paVar11->mNodeName).length = uVar17;
      memcpy((paVar11->mNodeName).data,local_430,uVar21);
      (paVar11->mNodeName).data[uVar21] = '\0';
      uVar21 = ((long)(pIVar6->pkeyPositions).
                      super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pIVar6->pkeyPositions).
                     super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      uVar17 = (uint)uVar21;
      paVar11->mNumPositionKeys = uVar17;
      paVar11->mNumScalingKeys =
           (uint)(((long)(pIVar6->pkeyPositions).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pIVar6->pkeyPositions).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
      paVar11->mNumRotationKeys =
           (uint)(((long)(pIVar6->pkeyPositions).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pIVar6->pkeyPositions).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
      uVar20 = (uVar21 & 0xffffffff) * 0x18;
      paVar12 = (aiVectorKey *)operator_new__(uVar20);
      if (uVar17 != 0) {
        lVar19 = 0;
        do {
          *(undefined4 *)((long)&(paVar12->mValue).z + lVar19) = 0;
          puVar1 = (undefined8 *)((long)&paVar12->mTime + lVar19);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar19 = lVar19 + 0x18;
        } while (uVar20 - lVar19 != 0);
      }
      paVar11->mPositionKeys = paVar12;
      uVar22 = (uVar21 & 0xffffffff) * 0x18;
      paVar12 = (aiVectorKey *)operator_new__(uVar22);
      if (uVar17 != 0) {
        lVar19 = 0;
        do {
          *(undefined4 *)((long)&(paVar12->mValue).z + lVar19) = 0;
          puVar1 = (undefined8 *)((long)&paVar12->mTime + lVar19);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar19 = lVar19 + 0x18;
        } while (uVar20 - lVar19 != 0);
      }
      paVar11->mScalingKeys = paVar12;
      paVar13 = (aiQuatKey *)operator_new__(uVar22);
      if (uVar17 != 0) {
        paVar16 = paVar13;
        do {
          paVar16->mTime = 0.0;
          (paVar16->mValue).w = 1.0;
          (paVar16->mValue).x = 0.0;
          (paVar16->mValue).y = 0.0;
          (paVar16->mValue).z = 0.0;
          paVar16 = paVar16 + 1;
        } while (paVar16 != paVar13 + (uVar21 & 0xffffffff));
      }
      local_464 = local_464 + 1;
      paVar11->mRotationKeys = paVar13;
      lVar19 = 0;
      for (uVar20 = 0; uVar20 < (uVar21 & 0xffffffff); uVar20 = uVar20 + 1) {
        paVar18 = (pIVar6->pkeyPositions).
                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar12 = paVar11->mPositionKeys;
        *(undefined4 *)((long)&(paVar12->mValue).z + lVar19) =
             *(undefined4 *)((long)&(paVar18->mValue).z + lVar19);
        puVar1 = (undefined8 *)((long)&paVar18->mTime + lVar19);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&paVar12->mTime + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        paVar18 = (pIVar6->pkeyScalings).
                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar12 = paVar11->mScalingKeys;
        *(undefined4 *)((long)&(paVar12->mValue).z + lVar19) =
             *(undefined4 *)((long)&(paVar18->mValue).z + lVar19);
        puVar1 = (undefined8 *)((long)&paVar18->mTime + lVar19);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&paVar12->mTime + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        paVar7 = (pIVar6->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        paVar13 = paVar11->mRotationKeys;
        *(undefined8 *)((long)&(paVar13->mValue).y + lVar19) =
             *(undefined8 *)((long)&(paVar7->mValue).y + lVar19);
        puVar1 = (undefined8 *)((long)&paVar7->mTime + lVar19);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&paVar13->mTime + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        uVar21 = (ulong)paVar11->mNumPositionKeys;
        lVar19 = lVar19 + 0x18;
      }
      uVar21 = (ulong)*(uint *)(puVar5 + 8);
    }
  }
  this->pScene->mNumAnimations = 1;
  ppaVar14 = (aiAnimation **)operator_new__(8);
  this->pScene->mAnimations = ppaVar14;
  *this->pScene->mAnimations = this_00;
  return;
}

Assistant:

void MDLImporter::BuildOutputAnims_3DGS_MDL7(
    const MDL::IntBone_MDL7** apcBonesOut)
{
    ai_assert(NULL != apcBonesOut);
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // one animation ...
    aiAnimation* pcAnim = new aiAnimation();
    for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
        if (!apcBonesOut[i]->pkeyPositions.empty()) {

            // get the last frame ... (needn't be equal to pcHeader->frames_num)
            for (size_t qq = 0; qq < apcBonesOut[i]->pkeyPositions.size();++qq) {
                pcAnim->mDuration = std::max(pcAnim->mDuration, (double)
                    apcBonesOut[i]->pkeyPositions[qq].mTime);
            }
            ++pcAnim->mNumChannels;
        }
    }
    if (pcAnim->mDuration)  {
        pcAnim->mChannels = new aiNodeAnim*[pcAnim->mNumChannels];

        unsigned int iCnt = 0;
        for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
            if (!apcBonesOut[i]->pkeyPositions.empty()) {
                const MDL::IntBone_MDL7* const intBone = apcBonesOut[i];

                aiNodeAnim* const pcNodeAnim = pcAnim->mChannels[iCnt++] = new aiNodeAnim();
                pcNodeAnim->mNodeName = aiString( intBone->mName );

                // allocate enough storage for all keys
                pcNodeAnim->mNumPositionKeys = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumScalingKeys  = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumRotationKeys = (unsigned int)intBone->pkeyPositions.size();

                pcNodeAnim->mPositionKeys = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mScalingKeys  = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mRotationKeys = new aiQuatKey[pcNodeAnim->mNumPositionKeys];

                // copy all keys
                for (unsigned int qq = 0; qq < pcNodeAnim->mNumPositionKeys;++qq)   {
                    pcNodeAnim->mPositionKeys[qq] = intBone->pkeyPositions[qq];
                    pcNodeAnim->mScalingKeys[qq] = intBone->pkeyScalings[qq];
                    pcNodeAnim->mRotationKeys[qq] = intBone->pkeyRotations[qq];
                }
            }
        }

        // store the output animation
        pScene->mNumAnimations = 1;
        pScene->mAnimations = new aiAnimation*[1];
        pScene->mAnimations[0] = pcAnim;
    }
    else delete pcAnim;
}